

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_mathlib.cpp
# Opt level: O3

int __thiscall astc::rand(astc *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *(ulong *)this;
  uVar2 = *(ulong *)(this + 8);
  uVar3 = uVar2 ^ uVar1;
  *(ulong *)this = uVar3 << 0x10 ^ (uVar1 << 0x18 | uVar1 >> 0x28) ^ uVar3;
  *(ulong *)(this + 8) = uVar3 << 0x25 | uVar3 >> 0x1b;
  return (int)uVar2 + (int)uVar1;
}

Assistant:

uint64_t astc::rand(uint64_t state[2])
{
	uint64_t s0 = state[0];
	uint64_t s1 = state[1];
	uint64_t res = s0 + s1;
	s1 ^= s0;
	state[0] = rotl(s0, 24) ^ s1 ^ (s1 << 16);
	state[1] = rotl(s1, 37);
	return res;
}